

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  float *in_RDI;
  int in_R8D;
  float fVar44;
  undefined1 auVar45 [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m256 _outp;
  __m256 _b;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_ratan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_25f0;
  undefined8 uStack_25e8;
  int local_25dc;
  float local_25d8;
  undefined1 local_25d1 [5];
  int local_25cc;
  float *local_25c8;
  undefined1 (*local_25c0) [32];
  undefined1 (*local_25b0) [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  float *local_2568;
  undefined1 (*local_2560) [32];
  undefined8 local_2550;
  undefined8 uStack_2548;
  float *local_2538;
  float local_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float local_2514;
  undefined8 local_2510;
  undefined8 uStack_2508;
  undefined8 *local_24f8;
  undefined8 *local_24f0;
  undefined1 *local_24e8;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined1 local_22e0 [8];
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  undefined4 local_22b0;
  undefined4 local_22ac;
  undefined4 local_22a8;
  undefined4 local_22a4;
  undefined1 local_22a0 [16];
  undefined1 auStack_2290 [16];
  undefined4 local_2280;
  undefined4 local_227c;
  undefined4 local_2278;
  undefined4 local_2274;
  undefined4 local_2270;
  undefined4 local_226c;
  undefined4 local_2268;
  undefined4 local_2264;
  undefined1 local_2260 [16];
  undefined1 auStack_2250 [16];
  undefined4 local_2240;
  undefined4 local_223c;
  undefined4 local_2238;
  undefined4 local_2234;
  undefined4 local_2230;
  undefined4 local_222c;
  undefined4 local_2228;
  undefined4 local_2224;
  undefined1 local_2220 [16];
  undefined1 auStack_2210 [16];
  undefined4 local_2200;
  undefined4 local_21fc;
  undefined4 local_21f8;
  undefined4 local_21f4;
  undefined4 local_21f0;
  undefined4 local_21ec;
  undefined4 local_21e8;
  undefined4 local_21e4;
  undefined1 local_21e0 [16];
  undefined1 auStack_21d0 [16];
  undefined4 local_21c0;
  undefined4 local_21bc;
  undefined4 local_21b8;
  undefined4 local_21b4;
  undefined4 local_21b0;
  undefined4 local_21ac;
  undefined4 local_21a8;
  undefined4 local_21a4;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined1 local_20e0 [32];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined1 local_20a0 [32];
  undefined1 local_2080 [32];
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined1 local_2040 [32];
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined1 local_1f60 [32];
  undefined1 local_1f40 [32];
  undefined1 local_1f20 [32];
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [32];
  undefined1 local_1ec0 [32];
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1e00 [32];
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  float local_1d40;
  float fStack_1d3c;
  float fStack_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  float fStack_1d24;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1d00;
  float fStack_1cfc;
  float fStack_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  float fStack_1ce4;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  float fStack_1ca4;
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [8];
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  float local_1a40;
  float fStack_1a3c;
  float fStack_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined4 local_1a14;
  undefined4 local_1a10;
  undefined4 local_1a0c;
  undefined4 local_1a08;
  undefined4 local_1a04;
  undefined4 local_1a00;
  undefined4 local_19fc;
  undefined4 local_19f8;
  undefined4 local_19f4;
  undefined4 local_19f0;
  undefined4 local_19ec;
  undefined4 local_19e8;
  undefined4 local_19e4;
  undefined1 local_19e0 [16];
  undefined1 auStack_19d0 [16];
  undefined4 local_19c0;
  undefined4 local_19bc;
  undefined4 local_19b8;
  undefined4 local_19b4;
  undefined4 local_19b0;
  undefined4 local_19ac;
  undefined4 local_19a8;
  undefined4 local_19a4;
  undefined1 local_19a0 [16];
  undefined1 auStack_1990 [16];
  undefined4 local_1980;
  undefined4 local_197c;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined4 local_1964;
  undefined1 local_1960 [16];
  undefined1 auStack_1950 [16];
  undefined4 local_1940;
  undefined4 local_193c;
  undefined4 local_1938;
  undefined4 local_1934;
  undefined4 local_1930;
  undefined4 local_192c;
  undefined4 local_1928;
  undefined4 local_1924;
  undefined1 local_1920 [16];
  undefined1 auStack_1910 [16];
  undefined4 local_1900;
  undefined4 local_18fc;
  undefined4 local_18f8;
  undefined4 local_18f4;
  undefined4 local_18f0;
  undefined4 local_18ec;
  undefined4 local_18e8;
  undefined4 local_18e4;
  undefined1 local_18e0 [16];
  undefined1 auStack_18d0 [16];
  undefined4 local_18c0;
  undefined4 local_18bc;
  undefined4 local_18b8;
  undefined4 local_18b4;
  undefined4 local_18b0;
  undefined4 local_18ac;
  undefined4 local_18a8;
  undefined4 local_18a4;
  undefined1 local_18a0 [16];
  undefined1 auStack_1890 [16];
  undefined4 local_1880;
  undefined4 local_187c;
  undefined4 local_1878;
  undefined4 local_1874;
  undefined4 local_1870;
  undefined4 local_186c;
  undefined4 local_1868;
  undefined4 local_1864;
  undefined1 local_1860 [16];
  undefined1 auStack_1850 [16];
  undefined4 local_1840;
  undefined4 local_183c;
  undefined4 local_1838;
  undefined4 local_1834;
  undefined4 local_1830;
  undefined4 local_182c;
  undefined4 local_1828;
  undefined4 local_1824;
  undefined1 local_1820 [16];
  undefined1 auStack_1810 [16];
  undefined4 local_1800;
  undefined4 local_17fc;
  undefined4 local_17f8;
  undefined4 local_17f4;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined1 local_17e0 [16];
  undefined1 auStack_17d0 [16];
  undefined4 local_17c0;
  undefined4 local_17bc;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined1 local_17a0 [16];
  undefined1 auStack_1790 [16];
  undefined4 local_1780;
  undefined4 local_177c;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  undefined4 local_1768;
  undefined4 local_1764;
  undefined1 local_1760 [16];
  undefined1 auStack_1750 [16];
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined4 local_1724;
  undefined1 local_1720 [16];
  undefined1 auStack_1710 [16];
  undefined4 local_1700;
  undefined4 local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  undefined4 local_16e4;
  undefined1 local_16e0 [16];
  undefined1 auStack_16d0 [16];
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined4 local_16a4;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  float *local_1598;
  float *local_1590;
  float *local_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 *local_14f8;
  float *local_14f0;
  float *local_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 *local_1458;
  float *local_1450;
  float *local_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 *local_13b8;
  float *local_13b0;
  float *local_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 *local_1318;
  undefined8 *local_1310;
  float *local_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 *local_1278;
  float *local_1270;
  float *local_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 *local_11d8;
  float *local_11d0;
  float *local_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 *local_1138;
  undefined8 *local_1130;
  float *local_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined1 local_f60 [32];
  undefined1 local_f40 [32];
  undefined1 local_f20 [32];
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined1 local_de0 [32];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined1 *local_d48;
  undefined1 local_d40 [16];
  undefined1 local_d30 [16];
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [8];
  float fStack_c38;
  float fStack_c34;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined1 local_bd0 [16];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [16];
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [16];
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [16];
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined4 uStack_9dc;
  undefined4 uStack_9d8;
  undefined4 uStack_9d4;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b8;
  undefined4 uStack_9b4;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined4 uStack_978;
  undefined4 uStack_974;
  undefined4 local_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  float *local_638;
  float *local_630;
  float *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 *local_5d8;
  float *local_5d0;
  float *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 *local_578;
  float *local_570;
  float *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 *local_518;
  float *local_510;
  float *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  float *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  float local_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 *local_458;
  float *local_450;
  float *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 *local_3f8;
  float *local_3f0;
  float *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 *local_398;
  undefined8 *local_390;
  float *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 (*local_48) [32];
  float *local_40;
  undefined1 *local_38;
  
  local_25d8 = *in_RDI;
  local_25dc = 0;
  if (in_R8D == 4) {
    local_2690 = *(undefined8 *)in_RDI;
    uStack_2688 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_2690 = CONCAT44(local_25d8,local_25d8);
    uStack_2688 = CONCAT44(local_25d8,local_25d8);
    local_2530 = local_25d8;
    fStack_252c = local_25d8;
    fStack_2528 = local_25d8;
    fStack_2524 = local_25d8;
    local_2514 = local_25d8;
  }
  local_25f0 = local_2690;
  uStack_25e8 = uStack_2688;
  if (in_R8D == 8) {
    local_26c0 = *(undefined8 *)in_RDI;
    uStack_26b8 = *(undefined8 *)(in_RDI + 2);
    uStack_26b0 = *(undefined8 *)(in_RDI + 4);
    uStack_26a8 = *(undefined8 *)(in_RDI + 6);
  }
  else {
    local_2510 = local_2690;
    uStack_2508 = uStack_2688;
    local_26c0 = local_2690;
    uStack_26b8 = uStack_2688;
    uStack_26b0 = local_2690;
    uStack_26a8 = uStack_2688;
  }
  local_2620 = local_26c0;
  uStack_2618 = uStack_26b8;
  uStack_2610 = uStack_26b0;
  uStack_2608 = uStack_26a8;
  local_25c8 = in_RDX;
  local_25c0 = in_RSI;
  for (; local_25dc + 7 < in_ECX; local_25dc = local_25dc + 8) {
    local_25b0 = local_25c0;
    local_2640 = *(undefined8 *)*local_25c0;
    uStack_2638 = *(undefined8 *)(*local_25c0 + 8);
    uStack_2630 = *(undefined8 *)(*local_25c0 + 0x10);
    uStack_2628 = *(undefined8 *)(*local_25c0 + 0x18);
    local_24e8 = local_25d1;
    local_24f0 = &local_2620;
    local_24f8 = &local_2640;
    local_2340 = local_26c0;
    uStack_2338 = uStack_26b8;
    uStack_2330 = uStack_26b0;
    uStack_2328 = uStack_26a8;
    auVar39._8_8_ = uStack_26b8;
    auVar39._0_8_ = local_26c0;
    auVar39._16_8_ = uStack_26b0;
    auVar39._24_8_ = uStack_26a8;
    auVar38._8_8_ = uStack_26b8;
    auVar38._0_8_ = local_26c0;
    auVar38._16_8_ = uStack_26b0;
    auVar38._24_8_ = uStack_26a8;
    auVar37._8_8_ = uStack_26b8;
    auVar37._0_8_ = local_26c0;
    auVar37._16_8_ = uStack_26b0;
    auVar37._24_8_ = uStack_26a8;
    auVar36._8_8_ = uStack_26b8;
    auVar36._0_8_ = local_26c0;
    auVar36._16_8_ = uStack_26b0;
    auVar36._24_8_ = uStack_26a8;
    local_22a4 = 0;
    local_2280 = 0;
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    local_22a0 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    auStack_2290 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    local_2360 = local_22a0._0_8_;
    uStack_2358 = local_22a0._8_8_;
    uStack_2350 = auStack_2290._0_8_;
    uStack_2348 = auStack_2290._8_8_;
    local_22a8 = 0x80000000;
    local_2240 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_2260 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_2250 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_2380 = local_2260._0_8_;
    uStack_2378 = local_2260._8_8_;
    uStack_2370 = auStack_2250._0_8_;
    uStack_2368 = auStack_2250._8_8_;
    local_22ac = 0x40490fdb;
    local_2200 = 0x40490fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    local_2220 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    auStack_2210 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    local_23a0 = local_2220._0_8_;
    uStack_2398 = local_2220._8_8_;
    uStack_2390 = auStack_2210._0_8_;
    uStack_2388 = auStack_2210._8_8_;
    local_22b0 = 0x3fc90fdb;
    local_21c0 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_21e0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_21d0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_23c0 = local_21e0._0_8_;
    uStack_23b8 = local_21e0._8_8_;
    uStack_23b0 = auStack_21d0._0_8_;
    uStack_23a8 = auStack_21d0._8_8_;
    auVar1._16_8_ = auStack_2290._0_8_;
    auVar1._0_16_ = local_22a0;
    auVar1._24_8_ = auStack_2290._8_8_;
    local_23e0 = vcmpps_avx(auVar36,auVar1,4);
    auVar3._16_8_ = auStack_2290._0_8_;
    auVar3._0_16_ = local_22a0;
    auVar3._24_8_ = auStack_2290._8_8_;
    local_2400 = vcmpps_avx(*local_25c0,auVar3,4);
    local_1f80 = local_23e0._0_8_;
    uStack_1f78 = local_23e0._8_8_;
    uStack_1f70 = local_23e0._16_8_;
    uStack_1f68 = local_23e0._24_8_;
    local_1fa0 = local_2400._0_8_;
    uStack_1f98 = local_2400._8_8_;
    uStack_1f90 = local_2400._16_8_;
    uStack_1f88 = local_2400._24_8_;
    local_2420 = vandps_avx(local_23e0,local_2400);
    local_1fc0 = local_2260._0_8_;
    uStack_1fb8 = local_2260._8_8_;
    uStack_1fb0 = auStack_2250._0_8_;
    uStack_1fa8 = auStack_2250._8_8_;
    auVar10._16_8_ = auStack_2250._0_8_;
    auVar10._0_16_ = local_2260;
    auVar10._24_8_ = auStack_2250._8_8_;
    local_2440 = vandps_avx(auVar10,auVar37);
    local_2000 = local_2260._0_8_;
    uStack_1ff8 = local_2260._8_8_;
    uStack_1ff0 = auStack_2250._0_8_;
    uStack_1fe8 = auStack_2250._8_8_;
    auVar9._16_8_ = auStack_2250._0_8_;
    auVar9._0_16_ = local_2260;
    auVar9._24_8_ = auStack_2250._8_8_;
    local_2460 = vandps_avx(auVar9,*local_25c0);
    auVar4._16_8_ = auStack_2290._0_8_;
    auVar4._0_16_ = local_22a0;
    auVar4._24_8_ = auStack_2290._8_8_;
    local_2080 = vcmpps_avx(auVar38,auVar4,1);
    local_2040 = vcmpps_avx(*local_25c0,auVar4,1);
    local_2060 = local_2260._0_8_;
    uStack_2058 = local_2260._8_8_;
    uStack_2050 = auStack_2250._0_8_;
    uStack_2048 = auStack_2250._8_8_;
    auVar8._16_8_ = auStack_2250._0_8_;
    auVar8._0_16_ = local_2260;
    auVar8._24_8_ = auStack_2250._8_8_;
    local_1e00 = vandps_avx(local_2040,auVar8);
    local_1e20 = local_2220._0_8_;
    uStack_1e18 = local_2220._8_8_;
    uStack_1e10 = auStack_2210._0_8_;
    uStack_1e08 = auStack_2210._8_8_;
    auVar13._16_8_ = auStack_2210._0_8_;
    auVar13._0_16_ = local_2220;
    auVar13._24_8_ = auStack_2210._8_8_;
    local_20a0 = vorps_avx(local_1e00,auVar13);
    local_2480 = vandps_avx(local_2080,local_20a0);
    local_1a80 = vdivps_avx(*local_25c0,auVar39);
    local_19e4 = 0x80000000;
    local_19c0 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_19e0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_19d0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_1aa0 = local_19e0._0_8_;
    uStack_1a98 = local_19e0._8_8_;
    uStack_1a90 = auStack_19d0._0_8_;
    uStack_1a88 = auStack_19d0._8_8_;
    local_19e8 = 0x3f800000;
    local_1980 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_19a0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_1990 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1ac0 = local_19a0._0_8_;
    uStack_1ab8 = local_19a0._8_8_;
    uStack_1ab0 = auStack_1990._0_8_;
    uStack_1aa8 = auStack_1990._8_8_;
    local_19ec = 0xbf800000;
    local_1940 = 0xbf800000;
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    local_1960 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    auStack_1950 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    local_1ae0 = local_1960._0_8_;
    uStack_1ad8 = local_1960._8_8_;
    uStack_1ad0 = auStack_1950._0_8_;
    uStack_1ac8 = auStack_1950._8_8_;
    local_19f0 = 0x3fc90fdb;
    local_1900 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_1920 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_1910 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_1b00 = local_1920._0_8_;
    uStack_1af8 = local_1920._8_8_;
    uStack_1af0 = auStack_1910._0_8_;
    uStack_1ae8 = auStack_1910._8_8_;
    local_19f4 = 0x3f800000;
    local_18c0 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_18e0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_18d0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1b20 = local_18e0._0_8_;
    uStack_1b18 = local_18e0._8_8_;
    uStack_1b10 = auStack_18d0._0_8_;
    uStack_1b08 = auStack_18d0._8_8_;
    local_19f8 = 0xbeaaaa53;
    local_1880 = 0xbeaaaa53;
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    local_18a0 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    auStack_1890 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    local_1b40 = local_18a0._0_8_;
    uStack_1b38 = local_18a0._8_8_;
    uStack_1b30 = auStack_1890._0_8_;
    uStack_1b28 = auStack_1890._8_8_;
    local_19fc = 0x3e4cb974;
    local_1840 = 0x3e4cb974;
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    local_1860 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    auStack_1850 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    local_1b60 = local_1860._0_8_;
    uStack_1b58 = local_1860._8_8_;
    uStack_1b50 = auStack_1850._0_8_;
    uStack_1b48 = auStack_1850._8_8_;
    local_1a00 = 0xbe117200;
    local_1800 = 0xbe117200;
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    local_1820 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    auStack_1810 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    local_1b80 = local_1820._0_8_;
    uStack_1b78 = local_1820._8_8_;
    uStack_1b70 = auStack_1810._0_8_;
    uStack_1b68 = auStack_1810._8_8_;
    local_1a04 = 0x3dd9ed24;
    local_17c0 = 0x3dd9ed24;
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    local_17e0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    auStack_17d0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    local_1ba0 = local_17e0._0_8_;
    uStack_1b98 = local_17e0._8_8_;
    uStack_1b90 = auStack_17d0._0_8_;
    uStack_1b88 = auStack_17d0._8_8_;
    local_1a08 = 0xbd99b01e;
    local_1780 = 0xbd99b01e;
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    local_17a0 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    auStack_1790 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    local_1bc0 = local_17a0._0_8_;
    uStack_1bb8 = local_17a0._8_8_;
    uStack_1bb0 = auStack_1790._0_8_;
    uStack_1ba8 = auStack_1790._8_8_;
    local_1a0c = 0x3d2edd4e;
    local_1740 = 0x3d2edd4e;
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    local_1760 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    auStack_1750 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    local_1be0 = local_1760._0_8_;
    uStack_1bd8 = local_1760._8_8_;
    uStack_1bd0 = auStack_1750._0_8_;
    uStack_1bc8 = auStack_1750._8_8_;
    local_1a10 = 0xbc83a25c;
    local_1700 = 0xbc83a25c;
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    local_1720 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    auStack_1710 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    local_1c00 = local_1720._0_8_;
    uStack_1bf8 = local_1720._8_8_;
    uStack_1bf0 = auStack_1710._0_8_;
    uStack_1be8 = auStack_1710._8_8_;
    local_1a14 = 0x3b3ac537;
    local_16c0 = 0x3b3ac537;
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    local_16e0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    auStack_16d0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    local_1c20 = local_16e0._0_8_;
    uStack_1c18 = local_16e0._8_8_;
    uStack_1c10 = auStack_16d0._0_8_;
    uStack_1c08 = auStack_16d0._8_8_;
    local_fc0 = local_19e0._0_8_;
    uStack_fb8 = local_19e0._8_8_;
    uStack_fb0 = auStack_19d0._0_8_;
    uStack_fa8 = auStack_19d0._8_8_;
    local_fe0 = local_1a80._0_8_;
    uStack_fd8 = local_1a80._8_8_;
    uStack_fd0 = local_1a80._16_8_;
    uStack_fc8 = local_1a80._24_8_;
    auVar17._16_8_ = auStack_19d0._0_8_;
    auVar17._0_16_ = local_19e0;
    auVar17._24_8_ = auStack_19d0._8_8_;
    local_1c40 = vandps_avx(auVar17,local_1a80);
    local_e40 = local_19e0._0_8_;
    uStack_e38 = local_19e0._8_8_;
    uStack_e30 = auStack_19d0._0_8_;
    uStack_e28 = auStack_19d0._8_8_;
    local_e60 = local_1a80._0_8_;
    uStack_e58 = local_1a80._8_8_;
    uStack_e50 = local_1a80._16_8_;
    uStack_e48 = local_1a80._24_8_;
    auVar20._16_8_ = auStack_19d0._0_8_;
    auVar20._0_16_ = local_19e0;
    auVar20._24_8_ = auStack_19d0._8_8_;
    auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
    local_1c60 = vandnps_avx(auVar20,local_1a80);
    auVar14._16_8_ = auStack_1990._0_8_;
    auVar14._0_16_ = local_19a0;
    auVar14._24_8_ = auStack_1990._8_8_;
    local_1c80 = vcmpps_avx(auVar14,local_1c60,1);
    local_1000 = local_1c80._0_8_;
    uStack_ff8 = local_1c80._8_8_;
    uStack_ff0 = local_1c80._16_8_;
    uStack_fe8 = local_1c80._24_8_;
    local_1020 = local_1960._0_8_;
    uStack_1018 = local_1960._8_8_;
    uStack_1010 = auStack_1950._0_8_;
    uStack_1008 = auStack_1950._8_8_;
    auVar16._16_8_ = auStack_1950._0_8_;
    auVar16._0_16_ = local_1960;
    auVar16._24_8_ = auStack_1950._8_8_;
    local_f00 = vandps_avx(local_1c80,auVar16);
    local_e80 = local_1c80._0_8_;
    uStack_e78 = local_1c80._8_8_;
    uStack_e70 = local_1c80._16_8_;
    uStack_e68 = local_1c80._24_8_;
    local_ea0 = local_1c60._0_8_;
    uStack_e98 = local_1c60._8_8_;
    uStack_e90 = local_1c60._16_8_;
    uStack_e88 = local_1c60._24_8_;
    local_f20 = vandnps_avx(local_1c80,local_1c60);
    local_15c0 = vorps_avx(local_f00,local_f20);
    local_1040 = local_1c80._0_8_;
    uStack_1038 = local_1c80._8_8_;
    uStack_1030 = local_1c80._16_8_;
    uStack_1028 = local_1c80._24_8_;
    local_1060 = local_1c60._0_8_;
    uStack_1058 = local_1c60._8_8_;
    uStack_1050 = local_1c60._16_8_;
    uStack_1048 = local_1c60._24_8_;
    local_f40 = vandps_avx(local_1c80,local_1c60);
    local_ec0 = local_1c80._0_8_;
    uStack_eb8 = local_1c80._8_8_;
    uStack_eb0 = local_1c80._16_8_;
    uStack_ea8 = local_1c80._24_8_;
    local_ee0 = local_19a0._0_8_;
    uStack_ed8 = local_19a0._8_8_;
    uStack_ed0 = auStack_1990._0_8_;
    uStack_ec8 = auStack_1990._8_8_;
    auVar19._16_8_ = auStack_1990._0_8_;
    auVar19._0_16_ = local_19a0;
    auVar19._24_8_ = auStack_1990._8_8_;
    local_f60 = vandnps_avx(local_1c80,auVar19);
    local_15e0 = vorps_avx(local_f40,local_f60);
    local_1ca0 = vdivps_avx(local_15c0,local_15e0);
    local_1620 = local_1ca0._0_8_;
    uStack_1618 = local_1ca0._8_8_;
    uStack_1610 = local_1ca0._16_8_;
    uStack_1608 = local_1ca0._24_8_;
    local_1600._0_4_ = local_1ca0._0_4_;
    local_1600._4_4_ = local_1ca0._4_4_;
    uStack_15f8._0_4_ = local_1ca0._8_4_;
    uStack_15f8._4_4_ = local_1ca0._12_4_;
    uStack_15f0._0_4_ = local_1ca0._16_4_;
    uStack_15f0._4_4_ = local_1ca0._20_4_;
    uStack_15e8._0_4_ = local_1ca0._24_4_;
    uStack_15e8._4_4_ = local_1ca0._28_4_;
    fStack_1ca4 = uStack_15e8._4_4_;
    local_1cc0 = (float)local_1600 * (float)local_1600;
    fStack_1cbc = local_1600._4_4_ * local_1600._4_4_;
    fStack_1cb8 = (float)uStack_15f8 * (float)uStack_15f8;
    fStack_1cb4 = uStack_15f8._4_4_ * uStack_15f8._4_4_;
    fStack_1cb0 = (float)uStack_15f0 * (float)uStack_15f0;
    fStack_1cac = uStack_15f0._4_4_ * uStack_15f0._4_4_;
    fStack_1ca8 = (float)uStack_15e8 * (float)uStack_15e8;
    local_1660 = CONCAT44(fStack_1cbc,local_1cc0);
    uStack_1658 = CONCAT44(fStack_1cb4,fStack_1cb8);
    uStack_1650 = CONCAT44(fStack_1cac,fStack_1cb0);
    uStack_1648 = CONCAT44(uStack_15e8._4_4_,fStack_1ca8);
    fStack_1cc4 = uStack_15e8._4_4_;
    local_1ce0 = local_1cc0 * local_1cc0;
    fStack_1cdc = fStack_1cbc * fStack_1cbc;
    fStack_1cd8 = fStack_1cb8 * fStack_1cb8;
    fStack_1cd4 = fStack_1cb4 * fStack_1cb4;
    fStack_1cd0 = fStack_1cb0 * fStack_1cb0;
    fStack_1ccc = fStack_1cac * fStack_1cac;
    fStack_1cc8 = fStack_1ca8 * fStack_1ca8;
    local_14e8 = &local_1ce0;
    local_1130 = &local_1c00;
    local_1138 = &local_1bc0;
    local_10c0 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_10b8 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_10b0 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_10a8 = CONCAT44(uStack_15e8._4_4_,fStack_1cc8);
    local_10e0._0_4_ = local_1720._0_4_;
    local_10e0._4_4_ = local_1720._4_4_;
    uStack_10d8._0_4_ = local_1720._8_4_;
    uStack_10d8._4_4_ = local_1720._12_4_;
    uStack_10d0._0_4_ = auStack_1710._0_4_;
    uStack_10d0._4_4_ = auStack_1710._4_4_;
    uStack_10c8._0_4_ = auStack_1710._8_4_;
    uStack_10c8._4_4_ = auStack_1710._12_4_;
    fStack_10e4 = uStack_10c8._4_4_;
    local_1100 = local_1ce0 * (float)local_10e0;
    fStack_10fc = fStack_1cdc * local_10e0._4_4_;
    fStack_10f8 = fStack_1cd8 * (float)uStack_10d8;
    fStack_10f4 = fStack_1cd4 * uStack_10d8._4_4_;
    fStack_10f0 = fStack_1cd0 * (float)uStack_10d0;
    fStack_10ec = fStack_1ccc * uStack_10d0._4_4_;
    fStack_10e8 = fStack_1cc8 * (float)uStack_10c8;
    local_1120._0_4_ = local_17a0._0_4_;
    local_1120._4_4_ = local_17a0._4_4_;
    uStack_1118._0_4_ = local_17a0._8_4_;
    uStack_1118._4_4_ = local_17a0._12_4_;
    uStack_1110._0_4_ = auStack_1790._0_4_;
    uStack_1110._4_4_ = auStack_1790._4_4_;
    uStack_1108._0_4_ = auStack_1790._8_4_;
    uStack_1108._4_4_ = auStack_1790._12_4_;
    local_1d60 = local_1100 + (float)local_1120;
    fStack_1d5c = fStack_10fc + local_1120._4_4_;
    fStack_1d58 = fStack_10f8 + (float)uStack_1118;
    fStack_1d54 = fStack_10f4 + uStack_1118._4_4_;
    fStack_1d50 = fStack_10f0 + (float)uStack_1110;
    fStack_1d4c = fStack_10ec + uStack_1110._4_4_;
    fStack_1d48 = fStack_10e8 + (float)uStack_1108;
    fStack_1d44 = uStack_10c8._4_4_ + uStack_1108._4_4_;
    local_11d0 = &local_1d60;
    local_11d8 = &local_1b80;
    local_1160 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_1158 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_1150 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_1148 = CONCAT44(uStack_15e8._4_4_,fStack_1cc8);
    local_1180 = CONCAT44(fStack_1d5c,local_1d60);
    uStack_1178 = CONCAT44(fStack_1d54,fStack_1d58);
    uStack_1170 = CONCAT44(fStack_1d4c,fStack_1d50);
    uStack_1168 = CONCAT44(fStack_1d44,fStack_1d48);
    local_11a0 = local_1ce0 * local_1d60;
    fStack_119c = fStack_1cdc * fStack_1d5c;
    fStack_1198 = fStack_1cd8 * fStack_1d58;
    fStack_1194 = fStack_1cd4 * fStack_1d54;
    fStack_1190 = fStack_1cd0 * fStack_1d50;
    fStack_118c = fStack_1ccc * fStack_1d4c;
    fStack_1188 = fStack_1cc8 * fStack_1d48;
    local_11c0._0_4_ = local_1820._0_4_;
    local_11c0._4_4_ = local_1820._4_4_;
    uStack_11b8._0_4_ = local_1820._8_4_;
    uStack_11b8._4_4_ = local_1820._12_4_;
    uStack_11b0._0_4_ = auStack_1810._0_4_;
    uStack_11b0._4_4_ = auStack_1810._4_4_;
    uStack_11a8._0_4_ = auStack_1810._8_4_;
    uStack_11a8._4_4_ = auStack_1810._12_4_;
    local_1d40 = local_11a0 + (float)local_11c0;
    fStack_1d3c = fStack_119c + local_11c0._4_4_;
    fStack_1d38 = fStack_1198 + (float)uStack_11b8;
    fStack_1d34 = fStack_1194 + uStack_11b8._4_4_;
    fStack_1d30 = fStack_1190 + (float)uStack_11b0;
    fStack_1d2c = fStack_118c + uStack_11b0._4_4_;
    fStack_1d28 = fStack_1188 + (float)uStack_11a8;
    fStack_1d24 = fStack_1d44 + uStack_11a8._4_4_;
    local_1270 = &local_1d40;
    local_1278 = &local_1b40;
    local_1200 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_11f8 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_11f0 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_11e8 = CONCAT44(uStack_15e8._4_4_,fStack_1cc8);
    local_1220 = CONCAT44(fStack_1d3c,local_1d40);
    uStack_1218 = CONCAT44(fStack_1d34,fStack_1d38);
    uStack_1210 = CONCAT44(fStack_1d2c,fStack_1d30);
    uStack_1208 = CONCAT44(fStack_1d24,fStack_1d28);
    local_1240 = local_1ce0 * local_1d40;
    fStack_123c = fStack_1cdc * fStack_1d3c;
    fStack_1238 = fStack_1cd8 * fStack_1d38;
    fStack_1234 = fStack_1cd4 * fStack_1d34;
    fStack_1230 = fStack_1cd0 * fStack_1d30;
    fStack_122c = fStack_1ccc * fStack_1d2c;
    fStack_1228 = fStack_1cc8 * fStack_1d28;
    local_1260._0_4_ = local_18a0._0_4_;
    local_1260._4_4_ = local_18a0._4_4_;
    uStack_1258._0_4_ = local_18a0._8_4_;
    uStack_1258._4_4_ = local_18a0._12_4_;
    uStack_1250._0_4_ = auStack_1890._0_4_;
    uStack_1250._4_4_ = auStack_1890._4_4_;
    uStack_1248._0_4_ = auStack_1890._8_4_;
    uStack_1248._4_4_ = auStack_1890._12_4_;
    local_1d20 = local_1240 + (float)local_1260;
    fStack_1d1c = fStack_123c + local_1260._4_4_;
    fStack_1d18 = fStack_1238 + (float)uStack_1258;
    fStack_1d14 = fStack_1234 + uStack_1258._4_4_;
    fStack_1d10 = fStack_1230 + (float)uStack_1250;
    fStack_1d0c = fStack_122c + uStack_1250._4_4_;
    fStack_1d08 = fStack_1228 + (float)uStack_1248;
    fStack_1d04 = fStack_1d24 + uStack_1248._4_4_;
    local_1310 = &local_1c20;
    local_1318 = &local_1be0;
    local_12a0 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_1298 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_1290 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_1288 = CONCAT44(uStack_15e8._4_4_,fStack_1cc8);
    local_12c0._0_4_ = local_16e0._0_4_;
    local_12c0._4_4_ = local_16e0._4_4_;
    uStack_12b8._0_4_ = local_16e0._8_4_;
    uStack_12b8._4_4_ = local_16e0._12_4_;
    uStack_12b0._0_4_ = auStack_16d0._0_4_;
    uStack_12b0._4_4_ = auStack_16d0._4_4_;
    uStack_12a8._0_4_ = auStack_16d0._8_4_;
    uStack_12a8._4_4_ = auStack_16d0._12_4_;
    fStack_12c4 = uStack_12a8._4_4_;
    local_12e0 = local_1ce0 * (float)local_12c0;
    fStack_12dc = fStack_1cdc * local_12c0._4_4_;
    fStack_12d8 = fStack_1cd8 * (float)uStack_12b8;
    fStack_12d4 = fStack_1cd4 * uStack_12b8._4_4_;
    fStack_12d0 = fStack_1cd0 * (float)uStack_12b0;
    fStack_12cc = fStack_1ccc * uStack_12b0._4_4_;
    fStack_12c8 = fStack_1cc8 * (float)uStack_12a8;
    local_1300._0_4_ = local_1760._0_4_;
    local_1300._4_4_ = local_1760._4_4_;
    uStack_12f8._0_4_ = local_1760._8_4_;
    uStack_12f8._4_4_ = local_1760._12_4_;
    uStack_12f0._0_4_ = auStack_1750._0_4_;
    uStack_12f0._4_4_ = auStack_1750._4_4_;
    uStack_12e8._0_4_ = auStack_1750._8_4_;
    uStack_12e8._4_4_ = auStack_1750._12_4_;
    local_1de0 = local_12e0 + (float)local_1300;
    fStack_1ddc = fStack_12dc + local_1300._4_4_;
    fStack_1dd8 = fStack_12d8 + (float)uStack_12f8;
    fStack_1dd4 = fStack_12d4 + uStack_12f8._4_4_;
    fStack_1dd0 = fStack_12d0 + (float)uStack_12f0;
    fStack_1dcc = fStack_12cc + uStack_12f0._4_4_;
    fStack_1dc8 = fStack_12c8 + (float)uStack_12e8;
    fStack_1dc4 = uStack_12a8._4_4_ + uStack_12e8._4_4_;
    local_13b0 = &local_1de0;
    local_13b8 = &local_1ba0;
    local_1340 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_1338 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_1330 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_1328 = CONCAT44(uStack_15e8._4_4_,fStack_1cc8);
    local_1360 = CONCAT44(fStack_1ddc,local_1de0);
    uStack_1358 = CONCAT44(fStack_1dd4,fStack_1dd8);
    uStack_1350 = CONCAT44(fStack_1dcc,fStack_1dd0);
    uStack_1348 = CONCAT44(fStack_1dc4,fStack_1dc8);
    local_1380 = local_1ce0 * local_1de0;
    fStack_137c = fStack_1cdc * fStack_1ddc;
    fStack_1378 = fStack_1cd8 * fStack_1dd8;
    fStack_1374 = fStack_1cd4 * fStack_1dd4;
    fStack_1370 = fStack_1cd0 * fStack_1dd0;
    fStack_136c = fStack_1ccc * fStack_1dcc;
    fStack_1368 = fStack_1cc8 * fStack_1dc8;
    local_13a0._0_4_ = local_17e0._0_4_;
    local_13a0._4_4_ = local_17e0._4_4_;
    uStack_1398._0_4_ = local_17e0._8_4_;
    uStack_1398._4_4_ = local_17e0._12_4_;
    uStack_1390._0_4_ = auStack_17d0._0_4_;
    uStack_1390._4_4_ = auStack_17d0._4_4_;
    uStack_1388._0_4_ = auStack_17d0._8_4_;
    uStack_1388._4_4_ = auStack_17d0._12_4_;
    local_1dc0 = local_1380 + (float)local_13a0;
    fStack_1dbc = fStack_137c + local_13a0._4_4_;
    fStack_1db8 = fStack_1378 + (float)uStack_1398;
    fStack_1db4 = fStack_1374 + uStack_1398._4_4_;
    fStack_1db0 = fStack_1370 + (float)uStack_1390;
    fStack_1dac = fStack_136c + uStack_1390._4_4_;
    fStack_1da8 = fStack_1368 + (float)uStack_1388;
    fStack_1da4 = fStack_1dc4 + uStack_1388._4_4_;
    local_1450 = &local_1dc0;
    local_1458 = &local_1b60;
    local_13e0 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_13d8 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_13d0 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_13c8 = CONCAT44(uStack_15e8._4_4_,fStack_1cc8);
    local_1400 = CONCAT44(fStack_1dbc,local_1dc0);
    uStack_13f8 = CONCAT44(fStack_1db4,fStack_1db8);
    uStack_13f0 = CONCAT44(fStack_1dac,fStack_1db0);
    uStack_13e8 = CONCAT44(fStack_1da4,fStack_1da8);
    local_1420 = local_1ce0 * local_1dc0;
    fStack_141c = fStack_1cdc * fStack_1dbc;
    fStack_1418 = fStack_1cd8 * fStack_1db8;
    fStack_1414 = fStack_1cd4 * fStack_1db4;
    fStack_1410 = fStack_1cd0 * fStack_1db0;
    fStack_140c = fStack_1ccc * fStack_1dac;
    fStack_1408 = fStack_1cc8 * fStack_1da8;
    local_1440._0_4_ = local_1860._0_4_;
    local_1440._4_4_ = local_1860._4_4_;
    uStack_1438._0_4_ = local_1860._8_4_;
    uStack_1438._4_4_ = local_1860._12_4_;
    uStack_1430._0_4_ = auStack_1850._0_4_;
    uStack_1430._4_4_ = auStack_1850._4_4_;
    uStack_1428._0_4_ = auStack_1850._8_4_;
    uStack_1428._4_4_ = auStack_1850._12_4_;
    local_1da0 = local_1420 + (float)local_1440;
    fStack_1d9c = fStack_141c + local_1440._4_4_;
    fStack_1d98 = fStack_1418 + (float)uStack_1438;
    fStack_1d94 = fStack_1414 + uStack_1438._4_4_;
    fStack_1d90 = fStack_1410 + (float)uStack_1430;
    fStack_1d8c = fStack_140c + uStack_1430._4_4_;
    fStack_1d88 = fStack_1408 + (float)uStack_1428;
    fStack_1d84 = fStack_1da4 + uStack_1428._4_4_;
    local_14f0 = &local_1da0;
    local_14f8 = &local_1b20;
    local_1480 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_1478 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_1470 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_1468 = CONCAT44(uStack_15e8._4_4_,fStack_1cc8);
    local_14a0 = CONCAT44(fStack_1d9c,local_1da0);
    uStack_1498 = CONCAT44(fStack_1d94,fStack_1d98);
    uStack_1490 = CONCAT44(fStack_1d8c,fStack_1d90);
    uStack_1488 = CONCAT44(fStack_1d84,fStack_1d88);
    local_14c0 = local_1ce0 * local_1da0;
    fStack_14bc = fStack_1cdc * fStack_1d9c;
    fStack_14b8 = fStack_1cd8 * fStack_1d98;
    fStack_14b4 = fStack_1cd4 * fStack_1d94;
    fStack_14b0 = fStack_1cd0 * fStack_1d90;
    fStack_14ac = fStack_1ccc * fStack_1d8c;
    fStack_14a8 = fStack_1cc8 * fStack_1d88;
    local_14e0._0_4_ = local_18e0._0_4_;
    local_14e0._4_4_ = local_18e0._4_4_;
    uStack_14d8._0_4_ = local_18e0._8_4_;
    uStack_14d8._4_4_ = local_18e0._12_4_;
    uStack_14d0._0_4_ = auStack_18d0._0_4_;
    uStack_14d0._4_4_ = auStack_18d0._4_4_;
    uStack_14c8._0_4_ = auStack_18d0._8_4_;
    uStack_14c8._4_4_ = auStack_18d0._12_4_;
    local_1d80 = local_14c0 + (float)local_14e0;
    fStack_1d7c = fStack_14bc + local_14e0._4_4_;
    fStack_1d78 = fStack_14b8 + (float)uStack_14d8;
    fStack_1d74 = fStack_14b4 + uStack_14d8._4_4_;
    fStack_1d70 = fStack_14b0 + (float)uStack_14d0;
    fStack_1d6c = fStack_14ac + uStack_14d0._4_4_;
    fStack_1d68 = fStack_14a8 + (float)uStack_14c8;
    fStack_1d64 = fStack_1d84 + uStack_14c8._4_4_;
    local_1588 = &local_1cc0;
    local_1590 = &local_1d20;
    local_1598 = &local_1d80;
    local_1520 = CONCAT44(fStack_1cbc,local_1cc0);
    uStack_1518 = CONCAT44(fStack_1cb4,fStack_1cb8);
    uStack_1510 = CONCAT44(fStack_1cac,fStack_1cb0);
    uStack_1508 = CONCAT44(uStack_15e8._4_4_,fStack_1ca8);
    local_1540 = CONCAT44(fStack_1d1c,local_1d20);
    uStack_1538 = CONCAT44(fStack_1d14,fStack_1d18);
    uStack_1530 = CONCAT44(fStack_1d0c,fStack_1d10);
    uStack_1528 = CONCAT44(fStack_1d04,fStack_1d08);
    local_1560 = local_1cc0 * local_1d20;
    fStack_155c = fStack_1cbc * fStack_1d1c;
    fStack_1558 = fStack_1cb8 * fStack_1d18;
    fStack_1554 = fStack_1cb4 * fStack_1d14;
    fStack_1550 = fStack_1cb0 * fStack_1d10;
    fStack_154c = fStack_1cac * fStack_1d0c;
    fStack_1548 = fStack_1ca8 * fStack_1d08;
    local_1580 = CONCAT44(fStack_1d7c,local_1d80);
    uStack_1578 = CONCAT44(fStack_1d74,fStack_1d78);
    uStack_1570 = CONCAT44(fStack_1d6c,fStack_1d70);
    uStack_1568 = CONCAT44(fStack_1d64,fStack_1d68);
    local_1d00 = local_1560 + local_1d80;
    fStack_1cfc = fStack_155c + fStack_1d7c;
    fStack_1cf8 = fStack_1558 + fStack_1d78;
    fStack_1cf4 = fStack_1554 + fStack_1d74;
    fStack_1cf0 = fStack_1550 + fStack_1d70;
    fStack_1cec = fStack_154c + fStack_1d6c;
    fStack_1ce8 = fStack_1548 + fStack_1d68;
    fStack_1ce4 = fStack_1d04 + fStack_1d64;
    local_1680 = CONCAT44(fStack_1cfc,local_1d00);
    uStack_1678 = CONCAT44(fStack_1cf4,fStack_1cf8);
    uStack_1670 = CONCAT44(fStack_1cec,fStack_1cf0);
    uStack_1668 = CONCAT44(fStack_1ce4,fStack_1ce8);
    local_16a0 = local_1ca0._0_8_;
    uStack_1698 = local_1ca0._8_8_;
    uStack_1690 = local_1ca0._16_8_;
    uStack_1688 = local_1ca0._24_8_;
    fStack_1a24 = uStack_15e8._4_4_;
    local_1a40 = local_1d00 * (float)local_1600;
    fStack_1a3c = fStack_1cfc * local_1600._4_4_;
    fStack_1a38 = fStack_1cf8 * (float)uStack_15f8;
    fStack_1a34 = fStack_1cf4 * uStack_15f8._4_4_;
    fStack_1a30 = fStack_1cf0 * (float)uStack_15f0;
    fStack_1a2c = fStack_1cec * uStack_15f0._4_4_;
    fStack_1a28 = fStack_1ce8 * (float)uStack_15e8;
    local_1080 = local_1c80._0_8_;
    uStack_1078 = local_1c80._8_8_;
    uStack_1070 = local_1c80._16_8_;
    uStack_1068 = local_1c80._24_8_;
    local_10a0 = local_1920._0_8_;
    uStack_1098 = local_1920._8_8_;
    uStack_1090 = auStack_1910._0_8_;
    uStack_1088 = auStack_1910._8_8_;
    auVar15._16_8_ = auStack_1910._0_8_;
    auVar15._0_16_ = local_1920;
    auVar15._24_8_ = auStack_1910._8_8_;
    _local_1a60 = vandps_avx(local_1c80,auVar15);
    local_f80 = local_1a40 + (float)local_1a60._0_4_;
    fStack_f7c = fStack_1a3c + (float)local_1a60._4_4_;
    fStack_f78 = fStack_1a38 + fStack_1a58;
    fStack_f74 = fStack_1a34 + fStack_1a54;
    fStack_f70 = fStack_1a30 + fStack_1a50;
    fStack_f6c = fStack_1a2c + fStack_1a4c;
    fStack_f68 = fStack_1a28 + fStack_1a48;
    fStack_f64 = uStack_15e8._4_4_ + fStack_1a44;
    local_fa0 = local_1c40._0_8_;
    uStack_f98 = local_1c40._8_8_;
    uStack_f90 = local_1c40._16_8_;
    uStack_f88 = local_1c40._24_8_;
    auVar18._4_4_ = fStack_f7c;
    auVar18._0_4_ = local_f80;
    auVar18._8_4_ = fStack_f78;
    auVar18._12_4_ = fStack_f74;
    auVar18._16_4_ = fStack_f70;
    auVar18._20_4_ = fStack_f6c;
    auVar18._24_4_ = fStack_f68;
    auVar18._28_4_ = fStack_f64;
    _local_22e0 = vorps_avx(auVar18,local_1c40);
    local_2300._0_4_ = local_2480._0_4_;
    local_2300._4_4_ = local_2480._4_4_;
    uStack_22f8._0_4_ = local_2480._8_4_;
    uStack_22f8._4_4_ = local_2480._12_4_;
    uStack_22f0._0_4_ = local_2480._16_4_;
    uStack_22f0._4_4_ = local_2480._20_4_;
    uStack_22e8._0_4_ = local_2480._24_4_;
    uStack_22e8._4_4_ = local_2480._28_4_;
    local_24a0 = (float)local_22e0._0_4_ + (float)local_2300;
    fStack_249c = (float)local_22e0._4_4_ + local_2300._4_4_;
    fStack_2498 = fStack_22d8 + (float)uStack_22f8;
    fStack_2494 = fStack_22d4 + uStack_22f8._4_4_;
    fStack_2490 = fStack_22d0 + (float)uStack_22f0;
    fStack_248c = fStack_22cc + uStack_22f0._4_4_;
    fStack_2488 = fStack_22c8 + (float)uStack_22e8;
    fStack_2484 = fStack_22c4 + uStack_22e8._4_4_;
    local_1e40 = local_2440._0_8_;
    uStack_1e38 = local_2440._8_8_;
    uStack_1e30 = local_2440._16_8_;
    uStack_1e28 = local_2440._24_8_;
    local_1e60 = local_2220._0_8_;
    uStack_1e58 = local_2220._8_8_;
    uStack_1e50 = auStack_2210._0_8_;
    uStack_1e48 = auStack_2210._8_8_;
    auVar12._16_8_ = auStack_2210._0_8_;
    auVar12._0_16_ = local_2220;
    auVar12._24_8_ = auStack_2210._8_8_;
    auVar3 = vorps_avx(local_2440,auVar12);
    auVar5._16_8_ = auStack_2290._0_8_;
    auVar5._0_16_ = local_22a0;
    auVar5._24_8_ = auStack_2290._8_8_;
    local_24c0 = vcmpps_avx(auVar3,auVar5,1);
    local_20c0 = local_2400._0_8_;
    uStack_20b8 = local_2400._8_8_;
    uStack_20b0 = local_2400._16_8_;
    uStack_20a8 = local_2400._24_8_;
    local_1e80 = local_2460._0_8_;
    uStack_1e78 = local_2460._8_8_;
    uStack_1e70 = local_2460._16_8_;
    uStack_1e68 = local_2460._24_8_;
    local_1ea0 = local_21e0._0_8_;
    uStack_1e98 = local_21e0._8_8_;
    uStack_1e90 = auStack_21d0._0_8_;
    uStack_1e88 = auStack_21d0._8_8_;
    auVar11._16_8_ = auStack_21d0._0_8_;
    auVar11._0_16_ = local_21e0;
    auVar11._24_8_ = auStack_21d0._8_8_;
    local_20e0 = vorps_avx(local_2460,auVar11);
    local_1f00 = vandps_avx(local_2400,local_20e0);
    local_dc0 = local_2400._0_8_;
    uStack_db8 = local_2400._8_8_;
    uStack_db0 = local_2400._16_8_;
    uStack_da8 = local_2400._24_8_;
    local_2100 = local_24c0._0_8_;
    uStack_20f8 = local_24c0._8_8_;
    uStack_20f0 = local_24c0._16_8_;
    uStack_20e8 = local_24c0._24_8_;
    local_2120 = local_2220._0_8_;
    uStack_2118 = local_2220._8_8_;
    uStack_2110 = auStack_2210._0_8_;
    uStack_2108 = auStack_2210._8_8_;
    auVar7._16_8_ = auStack_2210._0_8_;
    auVar7._0_16_ = local_2220;
    auVar7._24_8_ = auStack_2210._8_8_;
    local_1ec0 = vandps_avx(local_24c0,auVar7);
    local_d80 = local_24c0._0_8_;
    uStack_d78 = local_24c0._8_8_;
    uStack_d70 = local_24c0._16_8_;
    uStack_d68 = local_24c0._24_8_;
    local_da0 = local_22a0._0_8_;
    uStack_d98 = local_22a0._8_8_;
    uStack_d90 = auStack_2290._0_8_;
    uStack_d88 = auStack_2290._8_8_;
    auVar21._16_8_ = auStack_2290._0_8_;
    auVar21._0_16_ = local_22a0;
    auVar21._24_8_ = auStack_2290._8_8_;
    local_1ee0 = vandnps_avx(local_24c0,auVar21);
    local_de0 = vorps_avx(local_1ec0,local_1ee0);
    local_1f20 = vandnps_avx(local_2400,local_de0);
    local_24e0 = vorps_avx(local_1f00,local_1f20);
    local_2140 = local_2420._0_8_;
    uStack_2138 = local_2420._8_8_;
    uStack_2130 = local_2420._16_8_;
    uStack_2128 = local_2420._24_8_;
    local_2160 = CONCAT44(fStack_249c,local_24a0);
    uStack_2158 = CONCAT44(fStack_2494,fStack_2498);
    uStack_2150 = CONCAT44(fStack_248c,fStack_2490);
    uStack_2148 = CONCAT44(fStack_2484,fStack_2488);
    auVar6._8_8_ = uStack_2158;
    auVar6._0_8_ = local_2160;
    auVar6._16_8_ = uStack_2150;
    auVar6._24_8_ = uStack_2148;
    local_1f40 = vandps_avx(local_2420,auVar6);
    local_e20 = local_24e0._0_8_;
    uStack_e18 = local_24e0._8_8_;
    uStack_e10 = local_24e0._16_8_;
    uStack_e08 = local_24e0._24_8_;
    local_e00._0_4_ = local_2420._0_4_;
    local_e00._4_4_ = local_2420._4_4_;
    uStack_df8._0_4_ = local_2420._8_4_;
    uStack_df8._4_4_ = local_2420._12_4_;
    uStack_df0._0_4_ = local_2420._16_4_;
    uStack_df0._4_4_ = local_2420._20_4_;
    uStack_de8._0_4_ = local_2420._24_4_;
    uStack_de8._4_4_ = local_2420._28_4_;
    auVar45._0_4_ = (uint)local_e00 ^ auVar1._0_4_;
    auVar45._4_4_ = local_e00._4_4_ ^ auVar1._4_4_;
    auVar45._8_4_ = (uint)uStack_df8 ^ auVar1._8_4_;
    auVar45._12_4_ = uStack_df8._4_4_ ^ auVar1._12_4_;
    auVar45._16_4_ = (uint)uStack_df0 ^ auVar1._16_4_;
    auVar45._20_4_ = uStack_df0._4_4_ ^ auVar1._20_4_;
    auVar45._24_4_ = (uint)uStack_de8 ^ auVar1._24_4_;
    auVar45._28_4_ = uStack_de8._4_4_ ^ auVar1._28_4_;
    local_1f60 = vandps_avx(auVar45,local_24e0);
    local_2660 = vorps_avx(local_1f40,local_1f60);
    local_2568 = local_25c8;
    local_25a0 = local_2660._0_8_;
    uStack_2598 = local_2660._8_8_;
    uStack_2590 = local_2660._16_8_;
    uStack_2588 = local_2660._24_8_;
    *(undefined8 *)local_25c8 = local_2660._0_8_;
    *(undefined8 *)(local_25c8 + 2) = local_2660._8_8_;
    *(undefined8 *)(local_25c8 + 4) = local_2660._16_8_;
    *(undefined8 *)(local_25c8 + 6) = local_2660._24_8_;
    local_25c0 = local_25c0 + 1;
    local_25c8 = local_25c8 + 8;
    local_2320 = local_2640;
    uStack_2318 = uStack_2638;
    uStack_2310 = uStack_2630;
    uStack_2308 = uStack_2628;
    local_2300 = local_2480._0_8_;
    uStack_22f8 = local_2480._8_8_;
    uStack_22f0 = local_2480._16_8_;
    uStack_22e8 = local_2480._24_8_;
    local_227c = local_2280;
    local_2278 = local_2280;
    local_2274 = local_2280;
    local_2270 = local_2280;
    local_226c = local_2280;
    local_2268 = local_2280;
    local_2264 = local_2280;
    local_223c = local_2240;
    local_2238 = local_2240;
    local_2234 = local_2240;
    local_2230 = local_2240;
    local_222c = local_2240;
    local_2228 = local_2240;
    local_2224 = local_2240;
    local_21fc = local_2200;
    local_21f8 = local_2200;
    local_21f4 = local_2200;
    local_21f0 = local_2200;
    local_21ec = local_2200;
    local_21e8 = local_2200;
    local_21e4 = local_2200;
    local_21bc = local_21c0;
    local_21b8 = local_21c0;
    local_21b4 = local_21c0;
    local_21b0 = local_21c0;
    local_21ac = local_21c0;
    local_21a8 = local_21c0;
    local_21a4 = local_21c0;
    local_21a0 = local_2340;
    uStack_2198 = uStack_2338;
    uStack_2190 = uStack_2330;
    uStack_2188 = uStack_2328;
    local_2180 = local_2640;
    uStack_2178 = uStack_2638;
    uStack_2170 = uStack_2630;
    uStack_2168 = uStack_2628;
    local_2020 = local_2640;
    uStack_2018 = uStack_2638;
    uStack_2010 = uStack_2630;
    uStack_2008 = uStack_2628;
    local_1fe0 = local_2340;
    uStack_1fd8 = uStack_2338;
    uStack_1fd0 = uStack_2330;
    uStack_1fc8 = uStack_2328;
    local_19bc = local_19c0;
    local_19b8 = local_19c0;
    local_19b4 = local_19c0;
    local_19b0 = local_19c0;
    local_19ac = local_19c0;
    local_19a8 = local_19c0;
    local_19a4 = local_19c0;
    local_197c = local_1980;
    local_1978 = local_1980;
    local_1974 = local_1980;
    local_1970 = local_1980;
    local_196c = local_1980;
    local_1968 = local_1980;
    local_1964 = local_1980;
    local_193c = local_1940;
    local_1938 = local_1940;
    local_1934 = local_1940;
    local_1930 = local_1940;
    local_192c = local_1940;
    local_1928 = local_1940;
    local_1924 = local_1940;
    local_18fc = local_1900;
    local_18f8 = local_1900;
    local_18f4 = local_1900;
    local_18f0 = local_1900;
    local_18ec = local_1900;
    local_18e8 = local_1900;
    local_18e4 = local_1900;
    local_18bc = local_18c0;
    local_18b8 = local_18c0;
    local_18b4 = local_18c0;
    local_18b0 = local_18c0;
    local_18ac = local_18c0;
    local_18a8 = local_18c0;
    local_18a4 = local_18c0;
    local_187c = local_1880;
    local_1878 = local_1880;
    local_1874 = local_1880;
    local_1870 = local_1880;
    local_186c = local_1880;
    local_1868 = local_1880;
    local_1864 = local_1880;
    local_183c = local_1840;
    local_1838 = local_1840;
    local_1834 = local_1840;
    local_1830 = local_1840;
    local_182c = local_1840;
    local_1828 = local_1840;
    local_1824 = local_1840;
    local_17fc = local_1800;
    local_17f8 = local_1800;
    local_17f4 = local_1800;
    local_17f0 = local_1800;
    local_17ec = local_1800;
    local_17e8 = local_1800;
    local_17e4 = local_1800;
    local_17bc = local_17c0;
    local_17b8 = local_17c0;
    local_17b4 = local_17c0;
    local_17b0 = local_17c0;
    local_17ac = local_17c0;
    local_17a8 = local_17c0;
    local_17a4 = local_17c0;
    local_177c = local_1780;
    local_1778 = local_1780;
    local_1774 = local_1780;
    local_1770 = local_1780;
    local_176c = local_1780;
    local_1768 = local_1780;
    local_1764 = local_1780;
    local_173c = local_1740;
    local_1738 = local_1740;
    local_1734 = local_1740;
    local_1730 = local_1740;
    local_172c = local_1740;
    local_1728 = local_1740;
    local_1724 = local_1740;
    local_16fc = local_1700;
    local_16f8 = local_1700;
    local_16f4 = local_1700;
    local_16f0 = local_1700;
    local_16ec = local_1700;
    local_16e8 = local_1700;
    local_16e4 = local_1700;
    local_16bc = local_16c0;
    local_16b8 = local_16c0;
    local_16b4 = local_16c0;
    local_16b0 = local_16c0;
    local_16ac = local_16c0;
    local_16a8 = local_16c0;
    local_16a4 = local_16c0;
    local_1640 = local_1660;
    uStack_1638 = uStack_1658;
    uStack_1630 = uStack_1650;
    uStack_1628 = uStack_1648;
    local_1600 = local_1620;
    uStack_15f8 = uStack_1618;
    uStack_15f0 = uStack_1610;
    uStack_15e8 = uStack_1608;
    fStack_1544 = fStack_1d04;
    local_14e0 = local_18e0._0_8_;
    uStack_14d8 = local_18e0._8_8_;
    uStack_14d0 = auStack_18d0._0_8_;
    uStack_14c8 = auStack_18d0._8_8_;
    fStack_14a4 = fStack_1d84;
    local_1448 = local_14e8;
    local_1440 = local_1860._0_8_;
    uStack_1438 = local_1860._8_8_;
    uStack_1430 = auStack_1850._0_8_;
    uStack_1428 = auStack_1850._8_8_;
    fStack_1404 = fStack_1da4;
    local_13a8 = local_14e8;
    local_13a0 = local_17e0._0_8_;
    uStack_1398 = local_17e0._8_8_;
    uStack_1390 = auStack_17d0._0_8_;
    uStack_1388 = auStack_17d0._8_8_;
    fStack_1364 = fStack_1dc4;
    local_1308 = local_14e8;
    local_1300 = local_1760._0_8_;
    uStack_12f8 = local_1760._8_8_;
    uStack_12f0 = auStack_1750._0_8_;
    uStack_12e8 = auStack_1750._8_8_;
    local_12c0 = local_16e0._0_8_;
    uStack_12b8 = local_16e0._8_8_;
    uStack_12b0 = auStack_16d0._0_8_;
    uStack_12a8 = auStack_16d0._8_8_;
    local_1268 = local_14e8;
    local_1260 = local_18a0._0_8_;
    uStack_1258 = local_18a0._8_8_;
    uStack_1250 = auStack_1890._0_8_;
    uStack_1248 = auStack_1890._8_8_;
    fStack_1224 = fStack_1d24;
    local_11c8 = local_14e8;
    local_11c0 = local_1820._0_8_;
    uStack_11b8 = local_1820._8_8_;
    uStack_11b0 = auStack_1810._0_8_;
    uStack_11a8 = auStack_1810._8_8_;
    fStack_1184 = fStack_1d44;
    local_1128 = local_14e8;
    local_1120 = local_17a0._0_8_;
    uStack_1118 = local_17a0._8_8_;
    uStack_1110 = auStack_1790._0_8_;
    uStack_1108 = auStack_1790._8_8_;
    local_10e0 = local_1720._0_8_;
    uStack_10d8 = local_1720._8_8_;
    uStack_10d0 = auStack_1710._0_8_;
    uStack_10c8 = auStack_1710._8_8_;
    local_e00 = local_2420._0_8_;
    uStack_df8 = local_2420._8_8_;
    uStack_df0 = local_2420._16_8_;
    uStack_de8 = local_2420._24_8_;
  }
  for (; local_25cc = in_ECX, local_25dc + 3 < in_ECX; local_25dc = local_25dc + 4) {
    local_2560 = local_25c0;
    local_2670 = *(undefined8 *)*local_25c0;
    uStack_2668 = *(undefined8 *)(*local_25c0 + 8);
    local_d48 = local_25d1;
    local_d50 = &local_25f0;
    local_d58 = &local_2670;
    local_c70 = local_2690;
    uStack_c68 = uStack_2688;
    auVar43._8_8_ = uStack_2688;
    auVar43._0_8_ = local_2690;
    auVar42._8_8_ = uStack_2688;
    auVar42._0_8_ = local_2690;
    auVar41._8_8_ = uStack_2688;
    auVar41._0_8_ = local_2690;
    auVar40._8_8_ = uStack_2688;
    auVar40._0_8_ = local_2690;
    local_984 = 0;
    local_964 = 0;
    local_980 = 0;
    local_c80 = 0;
    uStack_c78 = 0;
    local_9a4 = 0x80000000;
    local_988 = 0x80000000;
    local_9a0 = 0x80000000;
    local_c90 = 0x8000000080000000;
    uStack_c88 = 0x8000000080000000;
    local_9c4 = 0x40490fdb;
    local_9a8 = 0x40490fdb;
    local_9c0 = 0x40490fdb;
    local_ca0 = 0x40490fdb40490fdb;
    uStack_c98 = 0x40490fdb40490fdb;
    local_9e4 = 0x3fc90fdb;
    local_9c8 = 0x3fc90fdb;
    local_9e0 = 0x3fc90fdb;
    local_cb0 = 0x3fc90fdb3fc90fdb;
    uStack_ca8 = 0x3fc90fdb3fc90fdb;
    local_cc0 = vcmpps_avx(auVar40,ZEXT816(0),4);
    local_cd0 = vcmpps_avx(*(undefined1 (*) [16])*local_25c0,ZEXT816(0),4);
    local_b20 = local_cc0._0_8_;
    uStack_b18 = local_cc0._8_8_;
    local_b30 = local_cd0._0_8_;
    uStack_b28 = local_cd0._8_8_;
    local_ce0 = vpand_avx(local_cc0,local_cd0);
    auVar25._8_8_ = 0x8000000080000000;
    auVar25._0_8_ = 0x8000000080000000;
    local_cf0 = vpand_avx(auVar25,auVar41);
    auVar24._8_8_ = 0x8000000080000000;
    auVar24._0_8_ = 0x8000000080000000;
    local_d00 = vpand_avx(auVar24,*(undefined1 (*) [16])*local_25c0);
    local_ba0 = vcmpps_avx(auVar42,ZEXT816(0),1);
    local_b80 = vcmpps_avx(*(undefined1 (*) [16])*local_25c0,ZEXT816(0),1);
    auVar2._8_8_ = 0x8000000080000000;
    auVar2._0_8_ = 0x8000000080000000;
    local_a60 = vpand_avx(local_b80,auVar2);
    auVar28._8_8_ = 0x40490fdb40490fdb;
    auVar28._0_8_ = 0x40490fdb40490fdb;
    local_bb0 = vpor_avx(local_a60,auVar28);
    local_d10 = vpand_avx(local_ba0,local_bb0);
    local_770 = vdivps_avx(*(undefined1 (*) [16])*local_25c0,auVar43);
    local_134 = 0x80000000;
    local_114 = 0x80000000;
    local_130 = 0x80000000;
    local_780 = 0x8000000080000000;
    uStack_778 = 0x8000000080000000;
    local_154 = 0x3f800000;
    local_138 = 0x3f800000;
    local_150 = 0x3f800000;
    local_790 = 0x3f8000003f800000;
    uStack_788 = 0x3f8000003f800000;
    local_174 = 0xbf800000;
    local_158 = 0xbf800000;
    local_170 = 0xbf800000;
    local_7a0 = 0xbf800000bf800000;
    uStack_798 = 0xbf800000bf800000;
    local_194 = 0x3fc90fdb;
    local_178 = 0x3fc90fdb;
    local_190 = 0x3fc90fdb;
    local_7b0 = 0x3fc90fdb3fc90fdb;
    uStack_7a8 = 0x3fc90fdb3fc90fdb;
    local_1b4 = 0x3f800000;
    local_198 = 0x3f800000;
    local_1b0 = 0x3f800000;
    local_7c0 = 0x3f8000003f800000;
    uStack_7b8 = 0x3f8000003f800000;
    local_1d4 = 0xbeaaaa53;
    local_1b8 = 0xbeaaaa53;
    local_1d0 = 0xbeaaaa53;
    local_7d0 = 0xbeaaaa53beaaaa53;
    uStack_7c8 = 0xbeaaaa53beaaaa53;
    local_1f4 = 0x3e4cb974;
    local_1d8 = 0x3e4cb974;
    local_1f0 = 0x3e4cb974;
    local_7e0 = 0x3e4cb9743e4cb974;
    uStack_7d8 = 0x3e4cb9743e4cb974;
    local_214 = 0xbe117200;
    local_1f8 = 0xbe117200;
    local_210 = 0xbe117200;
    local_7f0 = 0xbe117200be117200;
    uStack_7e8 = 0xbe117200be117200;
    local_234 = 0x3dd9ed24;
    local_218 = 0x3dd9ed24;
    local_230 = 0x3dd9ed24;
    local_800 = 0x3dd9ed243dd9ed24;
    uStack_7f8 = 0x3dd9ed243dd9ed24;
    local_254 = 0xbd99b01e;
    local_238 = 0xbd99b01e;
    local_250 = 0xbd99b01e;
    local_810 = 0xbd99b01ebd99b01e;
    uStack_808 = 0xbd99b01ebd99b01e;
    local_274 = 0x3d2edd4e;
    local_258 = 0x3d2edd4e;
    local_270 = 0x3d2edd4e;
    local_820 = 0x3d2edd4e3d2edd4e;
    uStack_818 = 0x3d2edd4e3d2edd4e;
    local_294 = 0xbc83a25c;
    local_278 = 0xbc83a25c;
    local_290 = 0xbc83a25c;
    local_830 = 0xbc83a25cbc83a25c;
    uStack_828 = 0xbc83a25cbc83a25c;
    local_2b4 = 0x3b3ac537;
    local_298 = 0x3b3ac537;
    local_2b0 = 0x3b3ac537;
    local_840 = 0x3b3ac5373b3ac537;
    uStack_838 = 0x3b3ac5373b3ac537;
    local_660 = local_770._0_8_;
    uStack_658 = local_770._8_8_;
    auVar31._8_8_ = 0x8000000080000000;
    auVar31._0_8_ = 0x8000000080000000;
    local_850 = vpand_avx(auVar31,local_770);
    local_d0 = local_770._0_8_;
    uStack_c8 = local_770._8_8_;
    auVar35._8_8_ = 0x8000000080000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar2 = vpcmpeqd_avx(auVar28,auVar28);
    local_860 = vpandn_avx(auVar35,local_770);
    local_2e0 = local_860._0_8_;
    uStack_2d8 = local_860._8_8_;
    auVar33._8_8_ = 0x3f8000003f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    local_870 = vcmpps_avx(auVar33,local_860,1);
    local_670 = local_870._0_8_;
    uStack_668 = local_870._8_8_;
    auVar30._8_8_ = 0xbf800000bf800000;
    auVar30._0_8_ = 0xbf800000bf800000;
    local_2f0 = vpand_avx(local_870,auVar30);
    local_e0 = local_870._0_8_;
    uStack_d8 = local_870._8_8_;
    local_f0 = local_860._0_8_;
    uStack_e8 = local_860._8_8_;
    local_300 = vpandn_avx(local_870,local_860);
    local_6d0 = vpor_avx(local_2f0,local_300);
    local_690 = local_870._0_8_;
    uStack_688 = local_870._8_8_;
    local_6a0 = local_860._0_8_;
    uStack_698 = local_860._8_8_;
    local_310 = vpand_avx(local_870,local_860);
    local_100 = local_870._0_8_;
    uStack_f8 = local_870._8_8_;
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    local_320 = vpandn_avx(local_870,auVar34);
    local_6e0 = vpor_avx(local_310,local_320);
    local_880 = vdivps_avx(local_6d0,local_6e0);
    local_700 = local_880._0_8_;
    uStack_6f8 = local_880._8_8_;
    local_6f0._0_4_ = local_880._0_4_;
    local_6f0._4_4_ = local_880._4_4_;
    uStack_6e8._0_4_ = local_880._8_4_;
    uStack_6e8._4_4_ = local_880._12_4_;
    local_890 = (float)local_6f0 * (float)local_6f0;
    fStack_88c = local_6f0._4_4_ * local_6f0._4_4_;
    fStack_888 = (float)uStack_6e8 * (float)uStack_6e8;
    fStack_884 = uStack_6e8._4_4_ * uStack_6e8._4_4_;
    local_720 = CONCAT44(fStack_88c,local_890);
    uStack_718 = CONCAT44(fStack_884,fStack_888);
    local_8a0 = local_890 * local_890;
    fStack_89c = fStack_88c * fStack_88c;
    fStack_898 = fStack_888 * fStack_888;
    fStack_894 = fStack_884 * fStack_884;
    local_5c8 = &local_8a0;
    local_390 = &local_830;
    local_398 = &local_810;
    local_350 = CONCAT44(fStack_89c,local_8a0);
    uStack_348 = CONCAT44(fStack_894,fStack_898);
    local_360 = 0xbc83a25cbc83a25c;
    uStack_358 = 0xbc83a25cbc83a25c;
    local_370 = local_8a0 * -0.01606863;
    fStack_36c = fStack_89c * -0.01606863;
    fStack_368 = fStack_898 * -0.01606863;
    fStack_364 = fStack_894 * -0.01606863;
    local_380 = 0xbd99b01ebd99b01e;
    uStack_378 = 0xbd99b01ebd99b01e;
    local_8e0 = local_370 + -0.07504295;
    fStack_8dc = fStack_36c + -0.07504295;
    fStack_8d8 = fStack_368 + -0.07504295;
    fStack_8d4 = fStack_364 + -0.07504295;
    local_3f0 = &local_8e0;
    local_3f8 = &local_7f0;
    local_3b0 = CONCAT44(fStack_89c,local_8a0);
    uStack_3a8 = CONCAT44(fStack_894,fStack_898);
    local_3c0 = CONCAT44(fStack_8dc,local_8e0);
    uStack_3b8 = CONCAT44(fStack_8d4,fStack_8d8);
    local_3d0 = local_8a0 * local_8e0;
    fStack_3cc = fStack_89c * fStack_8dc;
    fStack_3c8 = fStack_898 * fStack_8d8;
    fStack_3c4 = fStack_894 * fStack_8d4;
    local_3e0 = 0xbe117200be117200;
    uStack_3d8 = 0xbe117200be117200;
    local_8d0 = local_3d0 + -0.14203644;
    fStack_8cc = fStack_3cc + -0.14203644;
    fStack_8c8 = fStack_3c8 + -0.14203644;
    fStack_8c4 = fStack_3c4 + -0.14203644;
    local_450 = &local_8d0;
    local_458 = &local_7d0;
    local_410 = CONCAT44(fStack_89c,local_8a0);
    uStack_408 = CONCAT44(fStack_894,fStack_898);
    local_420 = CONCAT44(fStack_8cc,local_8d0);
    uStack_418 = CONCAT44(fStack_8c4,fStack_8c8);
    local_430 = local_8a0 * local_8d0;
    fStack_42c = fStack_89c * fStack_8cc;
    fStack_428 = fStack_898 * fStack_8c8;
    fStack_424 = fStack_894 * fStack_8c4;
    local_440 = 0xbeaaaa53beaaaa53;
    uStack_438 = 0xbeaaaa53beaaaa53;
    local_8c0 = local_430 + -0.33333072;
    fStack_8bc = fStack_42c + -0.33333072;
    fStack_8b8 = fStack_428 + -0.33333072;
    fStack_8b4 = fStack_424 + -0.33333072;
    local_4b0 = &local_840;
    local_4b8 = &local_820;
    local_470 = CONCAT44(fStack_89c,local_8a0);
    uStack_468 = CONCAT44(fStack_894,fStack_898);
    local_480 = 0x3b3ac5373b3ac537;
    uStack_478 = 0x3b3ac5373b3ac537;
    local_490 = local_8a0 * 0.0028498897;
    fStack_48c = fStack_89c * 0.0028498897;
    fStack_488 = fStack_898 * 0.0028498897;
    fStack_484 = fStack_894 * 0.0028498897;
    local_4a0 = 0x3d2edd4e3d2edd4e;
    uStack_498 = 0x3d2edd4e3d2edd4e;
    local_920 = local_490 + 0.04269152;
    fStack_91c = fStack_48c + 0.04269152;
    fStack_918 = fStack_488 + 0.04269152;
    fStack_914 = fStack_484 + 0.04269152;
    local_510 = &local_920;
    local_518 = &local_800;
    local_4d0 = CONCAT44(fStack_89c,local_8a0);
    uStack_4c8 = CONCAT44(fStack_894,fStack_898);
    local_4e0 = CONCAT44(fStack_91c,local_920);
    uStack_4d8 = CONCAT44(fStack_914,fStack_918);
    local_4f0 = local_8a0 * local_920;
    fStack_4ec = fStack_89c * fStack_91c;
    fStack_4e8 = fStack_898 * fStack_918;
    fStack_4e4 = fStack_894 * fStack_914;
    local_500 = 0x3dd9ed243dd9ed24;
    uStack_4f8 = 0x3dd9ed243dd9ed24;
    local_910 = local_4f0 + 0.10640934;
    fStack_90c = fStack_4ec + 0.10640934;
    fStack_908 = fStack_4e8 + 0.10640934;
    fStack_904 = fStack_4e4 + 0.10640934;
    local_570 = &local_910;
    local_578 = &local_7e0;
    local_530 = CONCAT44(fStack_89c,local_8a0);
    uStack_528 = CONCAT44(fStack_894,fStack_898);
    local_540 = CONCAT44(fStack_90c,local_910);
    uStack_538 = CONCAT44(fStack_904,fStack_908);
    local_550 = local_8a0 * local_910;
    fStack_54c = fStack_89c * fStack_90c;
    fStack_548 = fStack_898 * fStack_908;
    fStack_544 = fStack_894 * fStack_904;
    local_560 = 0x3e4cb9743e4cb974;
    uStack_558 = 0x3e4cb9743e4cb974;
    local_900 = local_550 + 0.1999262;
    fStack_8fc = fStack_54c + 0.1999262;
    fStack_8f8 = fStack_548 + 0.1999262;
    fStack_8f4 = fStack_544 + 0.1999262;
    local_5d0 = &local_900;
    local_5d8 = &local_7c0;
    local_590 = CONCAT44(fStack_89c,local_8a0);
    uStack_588 = CONCAT44(fStack_894,fStack_898);
    local_5a0 = CONCAT44(fStack_8fc,local_900);
    uStack_598 = CONCAT44(fStack_8f4,fStack_8f8);
    local_5b0 = local_8a0 * local_900;
    fStack_5ac = fStack_89c * fStack_8fc;
    fStack_5a8 = fStack_898 * fStack_8f8;
    fStack_5a4 = fStack_894 * fStack_8f4;
    local_5c0 = 0x3f8000003f800000;
    uStack_5b8 = 0x3f8000003f800000;
    local_8f0 = local_5b0 + 1.0;
    fStack_8ec = fStack_5ac + 1.0;
    fStack_8e8 = fStack_5a8 + 1.0;
    fStack_8e4 = fStack_5a4 + 1.0;
    local_628 = &local_890;
    local_630 = &local_8c0;
    local_638 = &local_8f0;
    local_5f0 = CONCAT44(fStack_88c,local_890);
    uStack_5e8 = CONCAT44(fStack_884,fStack_888);
    local_600 = CONCAT44(fStack_8bc,local_8c0);
    uStack_5f8 = CONCAT44(fStack_8b4,fStack_8b8);
    local_610 = local_890 * local_8c0;
    fStack_60c = fStack_88c * fStack_8bc;
    fStack_608 = fStack_888 * fStack_8b8;
    fStack_604 = fStack_884 * fStack_8b4;
    local_620 = CONCAT44(fStack_8ec,local_8f0);
    uStack_618 = CONCAT44(fStack_8e4,fStack_8e8);
    local_8b0 = local_610 + local_8f0;
    fStack_8ac = fStack_60c + fStack_8ec;
    fStack_8a8 = fStack_608 + fStack_8e8;
    fStack_8a4 = fStack_604 + fStack_8e4;
    local_730 = CONCAT44(fStack_8ac,local_8b0);
    uStack_728 = CONCAT44(fStack_8a4,fStack_8a8);
    local_740 = local_880._0_8_;
    uStack_738 = local_880._8_8_;
    local_750 = local_8b0 * (float)local_6f0;
    fStack_74c = fStack_8ac * local_6f0._4_4_;
    fStack_748 = fStack_8a8 * (float)uStack_6e8;
    fStack_744 = fStack_8a4 * uStack_6e8._4_4_;
    local_6b0 = local_870._0_8_;
    uStack_6a8 = local_870._8_8_;
    auVar29._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar29._0_8_ = 0x3fc90fdb3fc90fdb;
    _local_760 = vpand_avx(local_870,auVar29);
    local_330 = local_750 + (float)local_760._0_4_;
    fStack_32c = fStack_74c + (float)local_760._4_4_;
    fStack_328 = fStack_748 + fStack_758;
    fStack_324 = fStack_744 + fStack_754;
    local_340 = local_850._0_8_;
    uStack_338 = local_850._8_8_;
    auVar32._4_4_ = fStack_32c;
    auVar32._0_4_ = local_330;
    auVar32._8_4_ = fStack_328;
    auVar32._12_4_ = fStack_324;
    _local_c40 = vpor_avx(auVar32,local_850);
    local_c50._0_4_ = local_d10._0_4_;
    local_c50._4_4_ = local_d10._4_4_;
    uStack_c48._0_4_ = local_d10._8_4_;
    uStack_c48._4_4_ = local_d10._12_4_;
    local_d20 = (float)local_c40._0_4_ + (float)local_c50;
    fStack_d1c = (float)local_c40._4_4_ + local_c50._4_4_;
    fStack_d18 = fStack_c38 + (float)uStack_c48;
    fStack_d14 = fStack_c34 + uStack_c48._4_4_;
    local_a80 = local_cf0._0_8_;
    uStack_a78 = local_cf0._8_8_;
    auVar27._8_8_ = 0x40490fdb40490fdb;
    auVar27._0_8_ = 0x40490fdb40490fdb;
    local_a40 = vpor_avx(local_cf0,auVar27);
    local_d30 = vcmpps_avx(local_a40,ZEXT816(0),1);
    local_bc0 = local_cd0._0_8_;
    uStack_bb8 = local_cd0._8_8_;
    local_aa0 = local_d00._0_8_;
    uStack_a98 = local_d00._8_8_;
    auVar26._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar26._0_8_ = 0x3fc90fdb3fc90fdb;
    local_bd0 = vpor_avx(local_d00,auVar26);
    local_ae0 = vpand_avx(local_cd0,local_bd0);
    local_80 = local_cd0._0_8_;
    uStack_78 = local_cd0._8_8_;
    local_be0 = local_d30._0_8_;
    uStack_bd8 = local_d30._8_8_;
    auVar23._8_8_ = 0x40490fdb40490fdb;
    auVar23._0_8_ = 0x40490fdb40490fdb;
    local_ac0 = vpand_avx(local_d30,auVar23);
    local_60 = local_d30._0_8_;
    uStack_58 = local_d30._8_8_;
    local_ad0 = vpandn_avx(local_d30,ZEXT816(0));
    local_90 = vpor_avx(local_ac0,local_ad0);
    local_af0 = vpandn_avx(local_cd0,local_90);
    local_d40 = vpor_avx(local_ae0,local_af0);
    local_c00 = local_ce0._0_8_;
    uStack_bf8 = local_ce0._8_8_;
    local_c10 = CONCAT44(fStack_d1c,local_d20);
    uStack_c08 = CONCAT44(fStack_d14,fStack_d18);
    auVar22._8_8_ = uStack_c08;
    auVar22._0_8_ = local_c10;
    local_b00 = vpand_avx(local_ce0,auVar22);
    local_a0 = local_ce0._0_8_;
    uStack_98 = local_ce0._8_8_;
    local_b0 = local_d40._0_8_;
    uStack_a8 = local_d40._8_8_;
    local_b10 = vpand_avx(local_ce0 ^ auVar2,local_d40);
    auVar2 = vpor_avx(local_b00,local_b10);
    local_2538 = local_25c8;
    local_2680 = auVar2._0_8_;
    local_2550 = local_2680;
    uStack_2678 = auVar2._8_8_;
    uStack_2548 = uStack_2678;
    *(undefined8 *)local_25c8 = local_2680;
    *(undefined8 *)(local_25c8 + 2) = uStack_2678;
    local_25c0 = (undefined1 (*) [32])(*local_25c0 + 0x10);
    local_25c8 = local_25c8 + 4;
    local_c60 = local_2670;
    uStack_c58 = uStack_2668;
    local_c50 = local_d10._0_8_;
    uStack_c48 = local_d10._8_8_;
    local_c30 = local_c70;
    uStack_c28 = uStack_c68;
    local_c20 = local_2670;
    uStack_c18 = uStack_2668;
    local_bf0 = local_ca0;
    uStack_be8 = uStack_c98;
    local_b90 = local_c90;
    uStack_b88 = uStack_c88;
    local_b70 = local_2670;
    uStack_b68 = uStack_2668;
    local_b60 = local_c90;
    uStack_b58 = uStack_c88;
    local_b50 = local_c70;
    uStack_b48 = uStack_c68;
    local_b40 = local_c90;
    uStack_b38 = uStack_c88;
    local_ab0 = local_cb0;
    uStack_aa8 = uStack_ca8;
    local_a90 = local_ca0;
    uStack_a88 = uStack_c98;
    local_a70 = local_ca0;
    uStack_a68 = uStack_c98;
    local_a50 = local_c80;
    uStack_a48 = uStack_c78;
    local_a30 = local_c80;
    uStack_a28 = uStack_c78;
    local_a20 = local_2670;
    uStack_a18 = uStack_2668;
    local_a10 = local_c80;
    uStack_a08 = uStack_c78;
    local_a00 = local_c70;
    uStack_9f8 = uStack_c68;
    uStack_9dc = local_9e0;
    uStack_9d8 = local_9e0;
    uStack_9d4 = local_9e0;
    uStack_9bc = local_9c0;
    uStack_9b8 = local_9c0;
    uStack_9b4 = local_9c0;
    uStack_99c = local_9a0;
    uStack_998 = local_9a0;
    uStack_994 = local_9a0;
    uStack_97c = local_980;
    uStack_978 = local_980;
    uStack_974 = local_980;
    local_960 = local_c80;
    uStack_958 = uStack_c78;
    local_950 = local_2670;
    uStack_948 = uStack_2668;
    local_940 = local_c80;
    uStack_938 = uStack_c78;
    local_930 = local_c70;
    uStack_928 = uStack_c68;
    local_710 = local_720;
    uStack_708 = uStack_718;
    local_6f0 = local_700;
    uStack_6e8 = uStack_6f8;
    local_6c0 = local_7b0;
    uStack_6b8 = uStack_7a8;
    local_680 = local_7a0;
    uStack_678 = uStack_798;
    local_650 = local_780;
    uStack_648 = uStack_778;
    local_568 = local_5c8;
    local_508 = local_5c8;
    local_4a8 = local_5c8;
    local_448 = local_5c8;
    local_3e8 = local_5c8;
    local_388 = local_5c8;
    local_2d0 = local_790;
    uStack_2c8 = uStack_788;
    uStack_2ac = local_2b0;
    uStack_2a8 = local_2b0;
    uStack_2a4 = local_2b0;
    uStack_28c = local_290;
    uStack_288 = local_290;
    uStack_284 = local_290;
    uStack_26c = local_270;
    uStack_268 = local_270;
    uStack_264 = local_270;
    uStack_24c = local_250;
    uStack_248 = local_250;
    uStack_244 = local_250;
    uStack_22c = local_230;
    uStack_228 = local_230;
    uStack_224 = local_230;
    uStack_20c = local_210;
    uStack_208 = local_210;
    uStack_204 = local_210;
    uStack_1ec = local_1f0;
    uStack_1e8 = local_1f0;
    uStack_1e4 = local_1f0;
    uStack_1cc = local_1d0;
    uStack_1c8 = local_1d0;
    uStack_1c4 = local_1d0;
    uStack_1ac = local_1b0;
    uStack_1a8 = local_1b0;
    uStack_1a4 = local_1b0;
    uStack_18c = local_190;
    uStack_188 = local_190;
    uStack_184 = local_190;
    uStack_16c = local_170;
    uStack_168 = local_170;
    uStack_164 = local_170;
    uStack_14c = local_150;
    uStack_148 = local_150;
    uStack_144 = local_150;
    uStack_12c = local_130;
    uStack_128 = local_130;
    uStack_124 = local_130;
    local_110 = local_790;
    uStack_108 = uStack_788;
    local_c0 = local_780;
    uStack_b8 = uStack_778;
    local_70 = local_c80;
    uStack_68 = uStack_c78;
  }
  for (; local_25dc < local_25cc; local_25dc = local_25dc + 1) {
    local_38 = local_25d1;
    local_40 = &local_25d8;
    local_48 = local_25c0;
    fVar44 = atan2f(*(float *)*local_25c0,local_25d8);
    *local_25c8 = fVar44;
    local_25c0 = (undefined1 (*) [32])(*local_25c0 + 4);
    local_25c8 = local_25c8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}